

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O2

int32_t __thiscall JHThread::Thread::Start(Thread *this)

{
  __uid_t _Var1;
  uint uVar2;
  sched_param prio;
  pthread_attr_t attrs;
  
  prio.sched_priority = sched_get_priority_max(2);
  pthread_attr_init((pthread_attr_t *)&attrs);
  if (0 < this->mPrio) {
    _Var1 = geteuid();
    if (_Var1 == 0) {
      pthread_attr_setschedpolicy((pthread_attr_t *)&attrs,2);
      pthread_attr_setschedparam((pthread_attr_t *)&attrs,(sched_param *)&prio);
    }
  }
  uVar2 = pthread_create(&this->mThread,(pthread_attr_t *)&attrs,start_thread,this);
  if (uVar2 != 0) {
    jh_log_print(0,"int32_t JHThread::Thread::Start()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Thread.cpp"
                 ,0xf7,"Error from pthread_create() is [%d]",(ulong)uVar2);
  }
  return uVar2;
}

Assistant:

int32_t Thread::Start()
{
	TRACE_BEGIN( LOG_LVL_INFO );

	int32_t rc = 0;
	pthread_attr_t attrs;
	struct sched_param prio;
	
	prio.sched_priority = sched_get_priority_max( SCHED_RR );
	
	LOG_INFO( "Creating Thread %s", GetName() );
	
	pthread_attr_init( &attrs );
	
	if ( mPrio > 0 && geteuid() == 0 )
	{
		pthread_attr_setschedpolicy( &attrs, SCHED_RR );
		pthread_attr_setschedparam( &attrs, &prio );
	}
	
	rc = pthread_create( &mThread, &attrs, start_thread, (void *)this );
	if ( rc != 0 )
	{
		LOG_ERR( "Error from pthread_create() is [%d]", rc );
	}
	
	LOG( "Thread create %d", rc );
	
	return rc;
}